

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int-view.h
# Opt level: O0

int64_t __thiscall IntView<2>::getVal(IntView<2> *this)

{
  int iVar1;
  long in_RDI;
  int64_t v;
  
  iVar1 = IntVar::getVal((IntVar *)0x26506a);
  return (long)*(int *)(in_RDI + 8) * (long)iVar1;
}

Assistant:

int64_t getVal() const {
		int64_t v = (type & 1) != 0 ? -var->getVal() : var->getVal();
		if ((type & 2) != 0) {
			v *= a;
		}
		if ((type & 4) != 0) {
			v += b;
		}
		return v;
	}